

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O2

string * __thiscall
HDD::GetIdentifyString_abi_cxx11_(string *__return_storage_ptr__,HDD *this,void *p,size_t n)

{
  char cVar1;
  pointer pcVar2;
  size_t i;
  ulong uVar3;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,p,(long)p + (n & 0xfffffffffffffffe));
  for (uVar3 = 0; uVar3 < (n & 0xfffffffffffffffe); uVar3 = uVar3 + 2) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = pcVar2[uVar3];
    pcVar2[uVar3] = pcVar2[uVar3 + 1];
    pcVar2[uVar3 + 1] = cVar1;
  }
  util::trim(&local_30,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string HDD::GetIdentifyString(void* p, size_t n)
{
    // Buffer length must be even
    n &= ~1;

    auto pcsz = reinterpret_cast<const char*>(p);
    std::string s(pcsz, n);

    // Copy the string, up to the size of the buffer
    for (size_t i = 0; i < n; i += 2)
        std::swap(s[i], s[i + 1]);

    // Trim leading and trailing spaces
    s = util::trim(s);

    return s;
}